

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  ScriptModuleType SVar2;
  pointer pMVar3;
  Module *this_00;
  pointer pSVar4;
  TextScriptModule *pTVar5;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar6;
  uchar *data;
  char *pcVar7;
  undefined8 uVar8;
  size_type sVar9;
  ulong uVar10;
  string *local_1d0;
  Binding local_190;
  Index local_168;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_163;
  allocator local_162;
  allocator local_161;
  Index command_index;
  string asStack_140 [32];
  iterator local_120;
  size_type local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  char *local_f8;
  size_type local_f0;
  size_t local_e8;
  undefined8 local_e0;
  char *local_d8;
  size_type local_d0;
  size_t local_c8;
  undefined8 local_c0;
  reference local_b8;
  Error *error;
  iterator __end3;
  iterator __begin3;
  Errors *__range3;
  char *filename;
  Errors errors;
  ReadBinaryOptions options;
  DataScriptModule<(wabt::ScriptModuleType)1> *bsm;
  Module *module;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> local_30;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  CommandPtr *out_command_local;
  Script *script_local;
  WastParser *this_local;
  
  script_module._M_t.
  super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
  super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
  super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       out_command;
  std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::
  unique_ptr<std::default_delete<wabt::ScriptModule>,void>
            ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)&local_30);
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._4_4_ =
       ParseScriptModule(this,&local_30);
  bVar1 = Failed(command._M_t.
                 super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                 .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_002454ad;
  }
  MakeUnique<wabt::ModuleCommand>();
  pMVar3 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
           operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                      &module);
  this_00 = &pMVar3->module;
  pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::operator->
                     (&local_30);
  SVar2 = ScriptModule::type(pSVar4);
  if (SVar2 == Text) {
    pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                       (&local_30);
    pTVar5 = cast<wabt::TextScriptModule,wabt::ScriptModule>(pSVar4);
    Module::operator=(this_00,&pTVar5->module);
LAB_002453f5:
    if (script != (Script *)0x0) {
      sVar9 = std::
              vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
              ::size(&script->commands);
      local_168 = (Index)sVar9;
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        Binding::Binding(&local_190,&this_00->loc,local_168);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&script->module_bindings,&(pMVar3->module).name,&local_190);
      }
      this->last_module_index_ = local_168;
    }
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
               script_module._M_t.
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
               (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&module
              );
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    if (SVar2 == Binary) {
      pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pDVar6 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(pSVar4);
      ReadBinaryOptions::ReadBinaryOptions
                ((ReadBinaryOptions *)
                 &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)this->options_;
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pDVar6->data);
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pDVar6->data);
      ReadBinaryIr("<text>",data,sVar9,
                   (ReadBinaryOptions *)
                   &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(Errors *)&filename,this_00);
      std::__cxx11::string::operator=((string *)&(pMVar3->module).name,(string *)&pDVar6->name);
      (this_00->loc).filename.data_ = (pDVar6->loc).filename.data_;
      (pMVar3->module).loc.filename.size_ = (pDVar6->loc).filename.size_;
      (pMVar3->module).loc.field_1.field_1.offset = (pDVar6->loc).field_1.field_1.offset;
      *(undefined8 *)((long)&(pMVar3->module).loc.field_1 + 8) =
           *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
      __end3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin
                         ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      error = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end
                                 ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                         *)&error), bVar1) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                   ::operator*(&__end3);
        if (local_b8->error_level != Error) {
          __assert_fail("error.error_level == ErrorLevel::Error",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                        ,0xb63,"Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)"
                       );
        }
        if ((local_b8->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          local_d8 = (pDVar6->loc).filename.data_;
          local_d0 = (pDVar6->loc).filename.size_;
          local_c8 = (pDVar6->loc).field_1.field_1.offset;
          local_c0 = *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          Error(this,0x2e7a7c,pcVar7);
        }
        else {
          local_f8 = (pDVar6->loc).filename.data_;
          local_f0 = (pDVar6->loc).filename.size_;
          local_e8 = (pDVar6->loc).field_1.field_1.offset;
          local_e0 = *(undefined8 *)((long)&(pDVar6->loc).field_1 + 8);
          pcVar7 = (char *)(local_b8->loc).field_1.field_1.offset;
          uVar8 = std::__cxx11::string::c_str();
          Error(this,0x2e7a97,pcVar7,uVar8);
        }
        __gnu_cxx::
        __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>::
        operator++(&__end3);
      }
      command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 4;
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      goto LAB_002453f5;
    }
    if (SVar2 != Quoted) goto LAB_002453f5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&command_index,"a binary module",&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_140,"a text module",&local_162);
    local_120 = (iterator)&command_index;
    local_118 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_163);
    __l._M_len = local_118;
    __l._M_array = local_120;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110,__l,&local_163);
    this_local._4_4_ = ErrorExpected(this,&local_110,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_163);
    local_1d0 = (string *)&local_120;
    do {
      local_1d0 = local_1d0 + -0x20;
      std::__cxx11::string::~string(local_1d0);
    } while (local_1d0 != (string *)&command_index);
    std::allocator<char>::~allocator((allocator<char> *)&local_162);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl._0_4_ = 1;
  std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
            ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&module);
LAB_002454ad:
  std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}